

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::torrent::load_merkle_trees
          (torrent *this,vector<std::vector<sha256_hash>,_file_index_t> *trees_import,
          vector<bitfield,_file_index_t> *mask,vector<bitfield,_file_index_t> *verified)

{
  pointer pvVar1;
  pointer pbVar2;
  int *piVar3;
  digest32<256L> *pdVar4;
  bool bVar5;
  file_index_t fVar6;
  file_storage *this_00;
  int64_t iVar7;
  size_t sVar8;
  long lVar9;
  __uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_> *verified_00;
  long lVar10;
  long lVar11;
  long lVar12;
  span<const_libtorrent::digest32<256L>_> t;
  span<const_libtorrent::digest32<256L>_> t_00;
  bitfield empty_verified;
  __uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_> local_58;
  vector<bitfield,_file_index_t> *local_50;
  vector<std::vector<sha256_hash>,_file_index_t> *local_48;
  pointer local_40;
  vector<bitfield,_file_index_t> *local_38;
  
  local_50 = mask;
  local_48 = trees_import;
  local_38 = verified;
  this_00 = torrent_info::orig_files
                      ((this->super_torrent_hot_members).m_torrent_file.
                       super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
  local_58._M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
  super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
       (tuple<unsigned_int_*,_std::default_delete<unsigned_int[]>_>)
       (_Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>)0x0;
  fVar6 = file_storage::end_file(this_00);
  if (0 < fVar6.m_val) {
    lVar11 = 4;
    lVar12 = 0;
    lVar10 = 0;
    lVar9 = 0;
    do {
      bVar5 = file_storage::pad_file_at(this_00,(file_index_t)(int)lVar9);
      if (!bVar5) {
        iVar7 = file_storage::file_size(this_00,(file_index_t)(int)lVar9);
        if (iVar7 != 0) {
          pvVar1 = (local_48->
                   super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                   ).
                   super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((int)((ulong)((long)(local_48->
                                  super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                                  ).
                                  super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) >> 3) *
              -0x55555555 <= lVar9) break;
          pbVar2 = (local_38->
                   super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>).
                   super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          verified_00 = (__uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_> *)
                        ((long)&(pbVar2->m_buf).
                                super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>
                        + lVar10);
          if ((int)((ulong)((long)(local_38->
                                  super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>
                                  ).
                                  super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) >> 3)
              <= lVar9) {
            verified_00 = &local_58;
          }
          pbVar2 = (local_50->
                   super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>).
                   super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (((lVar9 < (int)((ulong)((long)(local_50->
                                            super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>
                                            ).
                                            super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pbVar2) >> 3)) &&
              (piVar3 = *(int **)((long)&(pbVar2->m_buf).
                                         super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>
                                 + lVar10), piVar3 != (int *)0x0)) && (*piVar3 != 0)) {
            local_40 = pbVar2;
            sVar8 = merkle_tree::size((merkle_tree *)
                                      ((long)&((this->m_merkle_trees).
                                               super_vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
                                               .
                                               super__Vector_base<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->m_root +
                                      lVar12));
            bitfield::resize((bitfield *)
                             ((long)&(local_40->m_buf).
                                     super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>
                             + lVar10),(int)sVar8);
            pvVar1 = (local_48->
                     super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                     ).
                     super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pdVar4 = *(digest32<256L> **)((long)pvVar1 + lVar11 * 2 + -8);
            t.m_len = *(long *)((long)&(pvVar1->
                                       super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                       )._M_impl + lVar11 * 2) - (long)pdVar4 >> 5;
            t.m_ptr = pdVar4;
            merkle_tree::load_sparse_tree
                      ((merkle_tree *)
                       ((long)&((this->m_merkle_trees).
                                super_vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
                                .
                                super__Vector_base<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_root + lVar12),t,
                       (bitfield *)
                       ((long)&(((local_50->
                                 super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>
                                 ).
                                 super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_buf).
                               super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>
                       + lVar10),(bitfield *)verified_00);
          }
          else {
            pdVar4 = *(digest32<256L> **)((long)pvVar1 + lVar11 * 2 + -8);
            t_00.m_len = *(long *)((long)&(pvVar1->
                                          super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                          )._M_impl + lVar11 * 2) - (long)pdVar4 >> 5;
            t_00.m_ptr = pdVar4;
            merkle_tree::load_tree
                      ((merkle_tree *)
                       ((long)&((this->m_merkle_trees).
                                super_vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
                                .
                                super__Vector_base<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_root + lVar12),t_00,
                       (bitfield *)verified_00);
          }
        }
      }
      lVar9 = lVar9 + 1;
      fVar6 = file_storage::end_file(this_00);
      lVar10 = lVar10 + 8;
      lVar11 = lVar11 + 0xc;
      lVar12 = lVar12 + 0x30;
    } while (lVar9 < fVar6.m_val);
  }
  if (local_58._M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
      super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>)0x0) {
    operator_delete__((void *)local_58._M_t.
                              super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                              .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void torrent::load_merkle_trees(
		aux::vector<std::vector<sha256_hash>, file_index_t> trees_import
		, aux::vector<bitfield, file_index_t> mask
		, aux::vector<bitfield, file_index_t> verified)
	{
		auto const& fs = m_torrent_file->orig_files();

		bitfield const empty_verified;
		for (file_index_t i{0}; i < fs.end_file(); ++i)
		{
			if (fs.pad_file_at(i) || fs.file_size(i) == 0)
				continue;

			if (i >= trees_import.end_index()) break;
			bitfield const& verified_bitmask = (i >= verified.end_index()) ? empty_verified : verified[i];
			if (i < mask.end_index() && !mask[i].empty())
			{
				mask[i].resize(int(m_merkle_trees[i].size()));
				m_merkle_trees[i].load_sparse_tree(trees_import[i], mask[i], verified_bitmask);
			}
			else
			{
				m_merkle_trees[i].load_tree(trees_import[i], verified_bitmask);
			}
		}
	}